

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

CompilerGLSL * __thiscall
spirv_cross::CompilerGLSL::to_function_name_abi_cxx11_
          (CompilerGLSL *this,TextureFunctionNameArguments *args)

{
  SPIRType *pSVar1;
  bool bVar2;
  uint32_t id;
  CompilerError *pCVar3;
  undefined4 *in_RDX;
  char *local_140;
  char *local_138;
  allocator local_d1;
  string local_d0 [35];
  byte local_ad;
  undefined4 local_ac;
  bool workaround_lod_array_shadow_as_grad;
  SPIRType *pSStack_a8;
  VariableID tex;
  SPIRType *imgtype;
  string fname;
  allocator local_79;
  string local_78 [35];
  char local_55;
  allocator local_41;
  string local_40 [32];
  undefined4 *local_20;
  TextureFunctionNameArguments *args_local;
  CompilerGLSL *this_local;
  
  local_20 = in_RDX;
  args_local = args;
  this_local = this;
  if ((*(byte *)((long)in_RDX + 0x1d) & 1) != 0) {
    if ((args[0xbf].base.img.id & 1) != 0) {
      local_55 = '\x01';
      pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_40,"Sparse residency is not supported in ESSL.",&local_41);
      CompilerError::CompilerError(pCVar3,(string *)local_40);
      local_55 = '\0';
      __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
    }
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string(local_78,"GL_ARB_sparse_texture_clamp",&local_79);
    require_extension_internal((CompilerGLSL *)args,(string *)local_78);
    ::std::__cxx11::string::~string(local_78);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_79);
  }
  ::std::__cxx11::string::string((string *)&imgtype);
  pSVar1 = *(SPIRType **)(local_20 + 2);
  local_ac = *local_20;
  local_ad = 0;
  pSStack_a8 = pSVar1;
  if (((((pSVar1->image).arrayed & 1U) != 0) && ((pSVar1->image).dim == Dim2D)) ||
     ((pSVar1->image).dim == DimCube)) {
    id = TypedID::operator_cast_to_unsigned_int((TypedID *)&local_ac);
    bVar2 = Compiler::is_depth_image((Compiler *)args,pSVar1,id);
    if (((bVar2) && (local_20[8] != 0)) && ((*(byte *)(local_20 + 4) & 1) == 0)) {
      bVar2 = expression_is_constant_null((CompilerGLSL *)args,local_20[8]);
      if (!bVar2) {
        pCVar3 = (CompilerError *)__cxa_allocate_exception(0x10);
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string
                  (local_d0,
                   "textureLod on sampler2DArrayShadow is not constant 0.0. This cannot be expressed in GLSL."
                   ,&local_d1);
        CompilerError::CompilerError(pCVar3,(string *)local_d0);
        __cxa_throw(pCVar3,&CompilerError::typeinfo,CompilerError::~CompilerError);
      }
      local_ad = 1;
    }
  }
  if ((*(byte *)(local_20 + 7) & 1) != 0) {
    ::std::__cxx11::string::operator+=((string *)&imgtype,"sparse");
  }
  if ((*(byte *)(local_20 + 4) & 1) == 0) {
    if ((*(byte *)(local_20 + 7) & 1) == 0) {
      local_140 = "texture";
    }
    else {
      local_140 = "Texture";
    }
    ::std::__cxx11::string::operator+=((string *)&imgtype,local_140);
    if ((*(byte *)((long)local_20 + 0x11) & 1) != 0) {
      ::std::__cxx11::string::operator+=((string *)&imgtype,"Gather");
    }
    if ((*(byte *)(local_20 + 6) & 1) != 0) {
      ::std::__cxx11::string::operator+=((string *)&imgtype,"Offsets");
    }
    if ((*(byte *)((long)local_20 + 0x12) & 1) != 0) {
      ::std::__cxx11::string::operator+=((string *)&imgtype,"Proj");
    }
    if (((*(byte *)((long)local_20 + 0x1a) & 1) != 0) || ((local_ad & 1) != 0)) {
      ::std::__cxx11::string::operator+=((string *)&imgtype,"Grad");
    }
    if ((local_20[8] != 0) && ((local_ad & 1) == 0)) {
      ::std::__cxx11::string::operator+=((string *)&imgtype,"Lod");
    }
  }
  else {
    if ((*(byte *)(local_20 + 7) & 1) == 0) {
      local_138 = "texelFetch";
    }
    else {
      local_138 = "TexelFetch";
    }
    ::std::__cxx11::string::operator+=((string *)&imgtype,local_138);
  }
  if ((*(byte *)((long)local_20 + 0x19) & 1) != 0) {
    ::std::__cxx11::string::operator+=((string *)&imgtype,"Offset");
  }
  if ((*(byte *)((long)local_20 + 0x1d) & 1) != 0) {
    ::std::__cxx11::string::operator+=((string *)&imgtype,"Clamp");
  }
  if (((*(byte *)(local_20 + 7) & 1) != 0) || ((*(byte *)((long)local_20 + 0x1d) & 1) != 0)) {
    ::std::__cxx11::string::operator+=((string *)&imgtype,"ARB");
  }
  bVar2 = is_legacy((CompilerGLSL *)args);
  pSVar1 = pSStack_a8;
  if ((bVar2) && ((*(byte *)((long)local_20 + 0x11) & 1) == 0)) {
    TypedID::operator_cast_to_unsigned_int((TypedID *)&local_ac);
    legacy_tex_op(this,(string *)args,(SPIRType *)&imgtype,(uint32_t)pSVar1);
  }
  else {
    ::std::__cxx11::string::string((string *)this,(string *)&imgtype);
  }
  ::std::__cxx11::string::~string((string *)&imgtype);
  return this;
}

Assistant:

string CompilerGLSL::to_function_name(const TextureFunctionNameArguments &args)
{
	if (args.has_min_lod)
	{
		if (options.es)
			SPIRV_CROSS_THROW("Sparse residency is not supported in ESSL.");
		require_extension_internal("GL_ARB_sparse_texture_clamp");
	}

	string fname;
	auto &imgtype = *args.base.imgtype;
	VariableID tex = args.base.img;

	// textureLod on sampler2DArrayShadow and samplerCubeShadow does not exist in GLSL for some reason.
	// To emulate this, we will have to use textureGrad with a constant gradient of 0.
	// The workaround will assert that the LOD is in fact constant 0, or we cannot emit correct code.
	// This happens for HLSL SampleCmpLevelZero on Texture2DArray and TextureCube.
	bool workaround_lod_array_shadow_as_grad = false;
	if (((imgtype.image.arrayed && imgtype.image.dim == Dim2D) || imgtype.image.dim == DimCube) &&
	    is_depth_image(imgtype, tex) && args.lod && !args.base.is_fetch)
	{
		if (!expression_is_constant_null(args.lod))
		{
			SPIRV_CROSS_THROW("textureLod on sampler2DArrayShadow is not constant 0.0. This cannot be "
			                  "expressed in GLSL.");
		}
		workaround_lod_array_shadow_as_grad = true;
	}

	if (args.is_sparse_feedback)
		fname += "sparse";

	if (args.base.is_fetch)
		fname += args.is_sparse_feedback ? "TexelFetch" : "texelFetch";
	else
	{
		fname += args.is_sparse_feedback ? "Texture" : "texture";

		if (args.base.is_gather)
			fname += "Gather";
		if (args.has_array_offsets)
			fname += "Offsets";
		if (args.base.is_proj)
			fname += "Proj";
		if (args.has_grad || workaround_lod_array_shadow_as_grad)
			fname += "Grad";
		if (args.lod != 0 && !workaround_lod_array_shadow_as_grad)
			fname += "Lod";
	}

	if (args.has_offset)
		fname += "Offset";

	if (args.has_min_lod)
		fname += "Clamp";

	if (args.is_sparse_feedback || args.has_min_lod)
		fname += "ARB";

	return (is_legacy() && !args.base.is_gather) ? legacy_tex_op(fname, imgtype, tex) : fname;
}